

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O2

void nni_lmq_fini(nni_lmq *lmq)

{
  nni_msg *m;
  
  if (lmq != (nni_lmq *)0x0) {
    while (lmq->lmq_len != 0) {
      m = lmq->lmq_msgs[lmq->lmq_get];
      lmq->lmq_get = lmq->lmq_get + 1 & lmq->lmq_mask;
      lmq->lmq_len = lmq->lmq_len - 1;
      nni_msg_free(m);
    }
    if (lmq->lmq_alloc != 0) {
      nni_free(lmq->lmq_msgs,lmq->lmq_alloc << 3);
      return;
    }
  }
  return;
}

Assistant:

void
nni_lmq_fini(nni_lmq *lmq)
{
	if (lmq == NULL) {
		return;
	}

	/* Free any orphaned messages. */
	while (lmq->lmq_len > 0) {
		nng_msg *msg = lmq->lmq_msgs[lmq->lmq_get++];
		lmq->lmq_get &= lmq->lmq_mask;
		lmq->lmq_len--;
		nni_msg_free(msg);
	}
	if (lmq->lmq_alloc > 0) {
		nni_free(lmq->lmq_msgs, lmq->lmq_alloc * sizeof(nng_msg *));
	}
}